

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O0

bool __thiscall index::find_value(index *this,wchar_t key,wchar_t value)

{
  bool bVar1;
  pointer ppVar2;
  wchar_t in_EDX;
  _Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> iter;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  range;
  key_type *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  local_28;
  wchar_t local_18;
  
  local_18 = in_EDX;
  local_28 = std::
             unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
             ::equal_range((unordered_multimap<wchar_t,_character,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_character>_>_>
                            *)in_stack_ffffffffffffffd0._M_cur,in_stack_ffffffffffffffc8);
  this_00 = local_28.first.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
            _M_cur;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_wchar_t,_character>,_false> *)
                       &stack0xffffffffffffffd0,
                       &local_28.second.
                        super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>);
    if (!bVar1) {
      return false;
    }
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)
                        0x1177f7);
    if ((ppVar2->second).value == local_18) break;
    std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false> *)this_00._M_cur);
  }
  return true;
}

Assistant:

bool index::find_value(wchar_t key, wchar_t value)
{
    auto range = index_.equal_range(key);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == value)
        {
            return true;
        }
    }
    return false;
}